

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_ScrollParchment(double dmapx,double dmapy)

{
  FTexture *pFVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = mapxstart - dmapx * scale_mtof;
  dVar3 = mapystart - dmapy * scale_mtof;
  dVar2 = 40000.0;
  if (dVar4 <= 40000.0) {
    dVar2 = dVar4;
  }
  mapxstart = (double)(~-(ulong)(-40000.0 < dVar4) & 0xc0e3880000000000 |
                      (ulong)dVar2 & -(ulong)(-40000.0 < dVar4));
  dVar2 = 40000.0;
  if (dVar3 <= 40000.0) {
    dVar2 = dVar3;
  }
  mapystart = (double)(~-(ulong)(-40000.0 < dVar3) & 0xc0e3880000000000 |
                      (ulong)dVar2 & -(ulong)(-40000.0 < dVar3));
  if (((0 < (long)mapback.texnum) && ((uint)mapback.texnum < TexMan.Textures.Count)) &&
     (pFVar1 = TexMan.Textures.Array[mapback.texnum].Texture, pFVar1 != (FTexture *)0x0)) {
    dVar2 = (double)pFVar1->Width;
    for (; 0.0 < mapxstart; mapxstart = mapxstart - dVar2) {
    }
    for (; mapxstart <= (double)(int)-(uint)pFVar1->Width; mapxstart = mapxstart + dVar2) {
    }
    dVar2 = (double)pFVar1->Height;
    for (; 0.0 < mapystart; mapystart = mapystart - dVar2) {
    }
    for (; mapystart <= (double)(int)-(uint)pFVar1->Height; mapystart = mapystart + dVar2) {
    }
  }
  return;
}

Assistant:

static void AM_ScrollParchment (double dmapx, double dmapy)
{
	mapxstart = mapxstart - dmapx * scale_mtof;
	mapystart = mapystart - dmapy * scale_mtof;

	mapxstart = clamp(mapxstart, -40000., 40000.);
	mapystart = clamp(mapystart, -40000., 40000.);

	if (mapback.isValid())
	{
		FTexture *backtex = TexMan[mapback];

		if (backtex != NULL)
		{
			int pwidth = backtex->GetWidth();
			int pheight = backtex->GetHeight();

			while(mapxstart > 0)
				mapxstart -= pwidth;
			while(mapxstart <= -pwidth)
				mapxstart += pwidth;
			while(mapystart > 0)
				mapystart -= pheight;
			while(mapystart <= -pheight)
				mapystart += pheight;
		}
	}
}